

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O3

UniformGridMediumProvider *
pbrt::UniformGridMediumProvider::Create
          (ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  anon_struct_8_0_00000001_for___align aVar1;
  RGBColorSpace *cs;
  memory_resource *pmVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 uVar18;
  byte bVar19;
  byte bVar20;
  undefined1 auVar21 [16];
  Tuple2<pbrt::Point2,_float> TVar22;
  int iVar23;
  int ny_00;
  uint uVar24;
  float fVar25;
  float *__result;
  float *pfVar26;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar27;
  ulong uVar28;
  float *pfVar29;
  RGBColorSpace *pRVar30;
  char *message;
  int iVar31;
  PiecewiseLinearSpectrum *this;
  RGBSigmoidPolynomial *this_00;
  ushort uVar32;
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  Float FVar40;
  undefined1 auVar41 [16];
  undefined1 auVar44 [12];
  undefined1 auVar43 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar45 [60];
  span<const_float> v;
  span<const_pbrt::RGBUnboundedSpectrum> v_00;
  span<const_float> v_01;
  span<const_float> v_02;
  Point3f PVar46;
  Point3f PVar47;
  vector<pbrt::RGBUnboundedSpectrum,_std::allocator<pbrt::RGBUnboundedSpectrum>_> rgbSpectrumDensity
  ;
  SpectrumHandle Le;
  SampledGrid<float> LeGrid;
  int nz;
  int ny;
  int nx;
  vector<pbrt::RGB,_std::allocator<pbrt::RGB>_> rgbDensity;
  vector<float,_std::allocator<float>_> LeScale;
  vector<float,_std::allocator<float>_> density;
  RGBColorSpace *colorSpace;
  size_t nDensity;
  undefined1 local_1d8 [8];
  undefined8 uStack_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1c8;
  ParsedParameter *local_1b8;
  int local_1b0;
  undefined1 local_1a0 [48];
  bool local_170;
  undefined1 local_168 [24];
  undefined1 local_150 [8];
  undefined1 local_148 [16];
  memory_resource amStack_138 [6];
  float local_108;
  undefined4 uStack_104;
  int local_fc;
  int local_f8;
  int local_f4;
  vector<pbrt::RGB,_std::allocator<pbrt::RGB>_> local_f0;
  undefined1 local_d8 [12];
  float fStack_cc;
  pointer local_c8;
  vector<float,_std::allocator<float>_> local_c0;
  Tuple3<pbrt::Point3,_float> local_a8;
  ParameterDictionary *local_98;
  RGBColorSpace *local_90;
  unsigned_long local_88;
  polymorphic_allocator<std::byte> local_80;
  SpectrumHandle local_78;
  undefined8 local_70;
  optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_> local_68;
  ParsedParameter *pPVar39;
  undefined1 auVar42 [56];
  
  aVar1 = (anon_struct_8_0_00000001_for___align)((long)local_1a0 + 0x10);
  local_1a0._0_8_ = aVar1;
  local_80.memoryResource = alloc.memoryResource;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"density","");
  ParameterDictionary::GetFloatArray(&local_c0,parameters,(string *)local_1a0);
  if ((anon_struct_8_0_00000001_for___align)local_1a0._0_8_ != aVar1) {
    operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
  }
  local_1a0._0_8_ = aVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"density","");
  ParameterDictionary::GetRGBArray(&local_f0,parameters,(string *)local_1a0);
  if ((anon_struct_8_0_00000001_for___align)local_1a0._0_8_ != aVar1) {
    operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
  }
  if (local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    if (local_f0.super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_f0.super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      message = "No \"density\" values provided for uniform grid medium.";
      goto LAB_0037b672;
    }
  }
  else if (local_f0.super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl.
           super__Vector_impl_data._M_start !=
           local_f0.super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl.
           super__Vector_impl_data._M_finish) {
    message = "Both \"float\" and \"rgb\" \"density\" values were provided.";
LAB_0037b672:
    ErrorExit(loc,message);
  }
  local_1a0._0_8_ = aVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"nx","");
  iVar23 = ParameterDictionary::GetOneInt(parameters,(string *)local_1a0,1);
  if ((anon_struct_8_0_00000001_for___align)local_1a0._0_8_ != aVar1) {
    operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
  }
  local_1a0._0_8_ = aVar1;
  local_f4 = iVar23;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"ny","");
  ny_00 = ParameterDictionary::GetOneInt(parameters,(string *)local_1a0,1);
  if ((anon_struct_8_0_00000001_for___align)local_1a0._0_8_ != aVar1) {
    operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
  }
  local_1a0._0_8_ = aVar1;
  local_f8 = ny_00;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"nz","");
  amStack_138[4]._vptr_memory_resource._0_4_ =
       ParameterDictionary::GetOneInt(parameters,(string *)local_1a0,1);
  if ((anon_struct_8_0_00000001_for___align)local_1a0._0_8_ != aVar1) {
    operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
  }
  auVar45 = in_ZMM1._4_60_;
  local_fc = amStack_138[4]._vptr_memory_resource._0_4_;
  if (local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_88 = ((long)local_f0.super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_f0.super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  }
  else {
    local_88 = (long)local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2;
  }
  iVar31 = iVar23 * amStack_138[4]._vptr_memory_resource._0_4_ * ny_00;
  if (local_88 != (long)iVar31) {
    local_1a0._0_4_ = iVar31;
    ErrorExit<unsigned_long&,int>
              (loc,"Uniform grid medium has %d density values; expected nx*ny*nz = %d",&local_88,
               (int *)local_1a0);
  }
  cs = parameters->colorSpace;
  local_170 = false;
  local_68.set = false;
  local_90 = cs;
  if (local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_168._0_4_ = iVar23;
    aStack_1c8._M_allocated_capacity._0_4_ = 0;
    aStack_1c8._M_allocated_capacity._4_4_ = 0;
    local_1d8 = (undefined1  [8])0x0;
    uStack_1d0 = (RGBUnboundedSpectrum *)0x0;
    if (local_f0.super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_f0.super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uStack_1d0 = (RGBUnboundedSpectrum *)0x0;
    }
    else {
      pRVar30 = (RGBColorSpace *)
                local_f0.super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl.
                super__Vector_impl_data._M_start;
      _local_108 = alloc.memoryResource;
      local_98 = parameters;
      do {
        local_d8._8_4_ = (pRVar30->g).super_Tuple2<pbrt::Point2,_float>.x;
        local_d8._0_8_ = (pRVar30->r).super_Tuple2<pbrt::Point2,_float>;
        RGBUnboundedSpectrum::RGBUnboundedSpectrum
                  ((RGBUnboundedSpectrum *)local_148,cs,(RGB *)local_d8);
        if (uStack_1d0 ==
            (RGBUnboundedSpectrum *)
            CONCAT44(aStack_1c8._M_allocated_capacity._4_4_,aStack_1c8._M_allocated_capacity._0_4_))
        {
          std::vector<pbrt::RGBUnboundedSpectrum,_std::allocator<pbrt::RGBUnboundedSpectrum>_>::
          _M_realloc_insert<pbrt::RGBUnboundedSpectrum>
                    ((vector<pbrt::RGBUnboundedSpectrum,_std::allocator<pbrt::RGBUnboundedSpectrum>_>
                      *)local_1d8,uStack_1d0,(RGBUnboundedSpectrum *)local_148);
        }
        else {
          uStack_1d0->scale = (Float)local_148._0_4_;
          (uStack_1d0->rsp).c0 = (Float)local_148._4_4_;
          (uStack_1d0->rsp).c1 = (Float)local_148._8_4_;
          (uStack_1d0->rsp).c2 = (Float)local_148._12_4_;
          uStack_1d0 = uStack_1d0 + 1;
        }
        auVar45 = in_ZMM1._4_60_;
        pRVar30 = (RGBColorSpace *)&(pRVar30->g).super_Tuple2<pbrt::Point2,_float>.y;
        parameters = local_98;
        alloc.memoryResource = (memory_resource *)_local_108;
      } while (pRVar30 !=
               (RGBColorSpace *)
               local_f0.super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    v_00.n = (long)uStack_1d0 - (long)local_1d8 >> 4;
    iVar23 = local_168._0_4_;
    v_00.ptr = (RGBUnboundedSpectrum *)local_1d8;
    SampledGrid<pbrt::RGBUnboundedSpectrum>::SampledGrid
              ((SampledGrid<pbrt::RGBUnboundedSpectrum> *)local_148,v_00,local_168._0_4_,ny_00,
               amStack_138[4]._vptr_memory_resource._0_4_,alloc);
    pstd::optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>_>::operator=
              (&local_68,(SampledGrid<pbrt::RGBUnboundedSpectrum> *)local_148);
    pstd::
    vector<pbrt::RGBUnboundedSpectrum,_pstd::pmr::polymorphic_allocator<pbrt::RGBUnboundedSpectrum>_>
    ::~vector((vector<pbrt::RGBUnboundedSpectrum,_pstd::pmr::polymorphic_allocator<pbrt::RGBUnboundedSpectrum>_>
               *)local_148);
    if (local_1d8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_1d8,
                      CONCAT44(aStack_1c8._M_allocated_capacity._4_4_,
                               aStack_1c8._M_allocated_capacity._0_4_) - (long)local_1d8);
    }
  }
  else {
    v.n = (long)local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
    v.ptr = local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start;
    SampledGrid<float>::SampledGrid
              ((SampledGrid<float> *)local_148,v,iVar23,ny_00,
               amStack_138[4]._vptr_memory_resource._0_4_,alloc);
    pstd::optional<pbrt::SampledGrid<float>_>::operator=
              ((optional<pbrt::SampledGrid<float>_> *)local_1a0,(SampledGrid<float> *)local_148);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
              ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_148);
  }
  local_148._0_8_ = amStack_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"Le","");
  local_70 = 0;
  ParameterDictionary::GetOneSpectrum
            ((ParameterDictionary *)local_150,(string *)parameters,(SpectrumHandle *)local_148,
             (SpectrumType)&local_70,(Allocator)0x2);
  if ((memory_resource *)local_148._0_8_ != amStack_138) {
    operator_delete((void *)local_148._0_8_,
                    (ulong)((long)&(((string *)amStack_138[0]._vptr_memory_resource)->_M_dataplus).
                                   _M_p + 1));
  }
  if (local_150 == (undefined1  [8])0x0) {
LAB_0037b1e6:
    iVar31 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
    local_168._0_16_ = SUB6416(ZEXT464(0x3f800000),0);
    *(undefined4 *)CONCAT44(extraout_var,iVar31) = 0;
    local_150 = (undefined1  [8])(CONCAT44(extraout_var,iVar31) | 0x1000000000000);
  }
  else {
    if ((ulong)local_150 >> 0x32 == 0) {
      this = (PiecewiseLinearSpectrum *)((ulong)local_150 & 0xffffffffffff);
      if ((ulong)local_150 >> 0x31 == 0) {
        fVar25 = *(float *)&(this->lambdas).alloc.memoryResource;
      }
      else if (local_150._6_2_ == 2) {
        pfVar26 = (float *)(this->lambdas).nAlloc;
        pmVar2 = (this->values).alloc.memoryResource;
        if ((memory_resource *)0x1 < pmVar2) {
          auVar33 = ZEXT464((uint)*pfVar26);
          lVar27 = (long)pmVar2 * 4 + -4;
          pfVar29 = pfVar26;
          do {
            pfVar29 = pfVar29 + 1;
            fVar25 = auVar33._0_4_;
            auVar41 = vmaxss_avx(ZEXT416((uint)*pfVar29),auVar33._0_16_);
            auVar33 = ZEXT1664(auVar41);
            if (fVar25 < *pfVar29) {
              pfVar26 = pfVar29;
            }
            lVar27 = lVar27 + -4;
          } while (lVar27 != 0);
        }
        fVar25 = *pfVar26;
      }
      else {
        fVar25 = PiecewiseLinearSpectrum::MaxValue(this);
      }
LAB_0037b1da:
      auVar45 = ZEXT1260(SUB1612(ZEXT816(0) << 0x40,4));
      if ((fVar25 == 0.0) && (!NAN(fVar25))) goto LAB_0037b1e6;
    }
    else {
      uVar24 = local_150._6_2_ - 3;
      if (uVar24 < 3) {
        this_00 = (RGBSigmoidPolynomial *)((ulong)local_150 & 0xffffffffffff);
        if (uVar24 == 2) {
          local_168._0_4_ = this_00->c0;
          FVar40 = RGBSigmoidPolynomial::MaxValue((RGBSigmoidPolynomial *)&this_00->c1);
          fVar25 = FVar40 * (float)local_168._0_4_;
        }
        else {
          fVar25 = RGBSigmoidPolynomial::MaxValue(this_00);
        }
        goto LAB_0037b1da;
      }
      if ((uVar24 & 0x7ffffffe) == 2) {
        fVar25 = RGBIlluminantSpectrum::MaxValue
                           ((RGBIlluminantSpectrum *)((ulong)local_150 & 0xffffffffffff));
        goto LAB_0037b1da;
      }
    }
    local_78.
    super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
    .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
             )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
               )local_150;
    FVar40 = SpectrumToPhotometric(&local_78);
    auVar45 = (undefined1  [60])0x0;
    local_168._0_16_ = ZEXT416((uint)(1.0 / FVar40));
  }
  pPVar39 = (ParsedParameter *)0x0;
  amStack_138[1]._vptr_memory_resource = (_func_int **)0x0;
  local_148._8_8_ = (ParsedParameter *)0x0;
  amStack_138[0]._vptr_memory_resource = (_func_int **)0x0;
  local_1d8 = (undefined1  [8])&aStack_1c8;
  local_148._0_8_ = alloc.memoryResource;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"Lescale","");
  ParameterDictionary::GetFloatArray
            ((vector<float,_std::allocator<float>_> *)local_d8,parameters,(string *)local_1d8);
  if (local_1d8 != (undefined1  [8])&aStack_1c8) {
    operator_delete((void *)local_1d8,
                    CONCAT44(aStack_1c8._M_allocated_capacity._4_4_,
                             aStack_1c8._M_allocated_capacity._0_4_) + 1);
  }
  auVar44 = auVar45._0_12_;
  TVar22.y = fStack_cc;
  TVar22.x = (float)local_d8._8_4_;
  if ((Tuple2<pbrt::Point2,_float>)local_d8._0_8_ == TVar22) {
    local_a8.x = (float)local_168._0_4_;
    v_02.n = 1;
    v_02.ptr = &local_a8.x;
    pPVar39 = (ParsedParameter *)local_168._8_8_;
    SampledGrid<float>::SampledGrid((SampledGrid<float> *)local_1d8,v_02,1,1,1,alloc);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
              ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_148,
               (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_1d8);
  }
  else {
    fVar25 = (float)(ny_00 * iVar23 * amStack_138[4]._vptr_memory_resource._0_4_);
    v_01.n = (pointer)((long)TVar22 - local_d8._0_8_ >> 2);
    if (v_01.n != (pointer)(long)(int)fVar25) {
      local_a8.x = fVar25;
      local_1d8 = (undefined1  [8])v_01.n;
      ErrorExit<int&,int&,int&,int,unsigned_long>
                ("Expected %d x %d %d = %d values for \"Lescale\" but were given %d.",&local_f4,
                 &local_f8,&local_fc,(int *)&local_a8,(unsigned_long *)local_1d8);
    }
    if (0 < (int)fVar25) {
      auVar33 = vbroadcastss_avx512f(ZEXT416((uint)local_168._0_4_));
      auVar44 = auVar33._4_12_;
      auVar34 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar35 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar36 = vpbroadcastq_avx512f();
      pPVar39 = auVar36._8_8_;
      uVar28 = 0;
      do {
        auVar37 = vpbroadcastq_avx512f();
        auVar38 = vporq_avx512f(auVar37,auVar34);
        auVar37 = vporq_avx512f(auVar37,auVar35);
        uVar18 = vpcmpuq_avx512f(auVar37,auVar36,2);
        bVar19 = (byte)uVar18;
        uVar18 = vpcmpuq_avx512f(auVar38,auVar36,2);
        bVar20 = (byte)uVar18;
        uVar32 = CONCAT11(bVar20,bVar19);
        pfVar26 = (float *)(local_d8._0_8_ + uVar28 * 4);
        auVar37._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * (int)pfVar26[1];
        auVar37._0_4_ = (uint)(bVar19 & 1) * (int)*pfVar26;
        auVar37._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * (int)pfVar26[2];
        auVar37._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * (int)pfVar26[3];
        auVar37._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * (int)pfVar26[4];
        auVar37._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * (int)pfVar26[5];
        auVar37._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * (int)pfVar26[6];
        auVar37._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * (int)pfVar26[7];
        auVar37._32_4_ = (uint)(bVar20 & 1) * (int)pfVar26[8];
        auVar37._36_4_ = (uint)(bVar20 >> 1 & 1) * (int)pfVar26[9];
        auVar37._40_4_ = (uint)(bVar20 >> 2 & 1) * (int)pfVar26[10];
        auVar37._44_4_ = (uint)(bVar20 >> 3 & 1) * (int)pfVar26[0xb];
        auVar37._48_4_ = (uint)(bVar20 >> 4 & 1) * (int)pfVar26[0xc];
        auVar37._52_4_ = (uint)(bVar20 >> 5 & 1) * (int)pfVar26[0xd];
        auVar37._56_4_ = (uint)(bVar20 >> 6 & 1) * (int)pfVar26[0xe];
        auVar37._60_4_ = (uint)(bVar20 >> 7) * (int)pfVar26[0xf];
        auVar37 = vmulps_avx512f(auVar33,auVar37);
        pfVar26 = (float *)(local_d8._0_8_ + uVar28 * 4);
        bVar3 = (bool)((byte)(uVar32 >> 1) & 1);
        bVar4 = (bool)((byte)(uVar32 >> 2) & 1);
        bVar5 = (bool)((byte)(uVar32 >> 3) & 1);
        bVar6 = (bool)((byte)(uVar32 >> 4) & 1);
        bVar7 = (bool)((byte)(uVar32 >> 5) & 1);
        bVar8 = (bool)((byte)(uVar32 >> 6) & 1);
        bVar9 = (bool)((byte)(uVar32 >> 7) & 1);
        bVar10 = (bool)(bVar20 >> 1 & 1);
        bVar11 = (bool)(bVar20 >> 2 & 1);
        bVar12 = (bool)(bVar20 >> 3 & 1);
        bVar13 = (bool)(bVar20 >> 4 & 1);
        bVar14 = (bool)(bVar20 >> 5 & 1);
        bVar15 = (bool)(bVar20 >> 6 & 1);
        *pfVar26 = (float)((uint)(bVar19 & 1) * auVar37._0_4_ |
                          (uint)!(bool)(bVar19 & 1) * (int)*pfVar26);
        pfVar26[1] = (float)((uint)bVar3 * auVar37._4_4_ | (uint)!bVar3 * (int)pfVar26[1]);
        pfVar26[2] = (float)((uint)bVar4 * auVar37._8_4_ | (uint)!bVar4 * (int)pfVar26[2]);
        pfVar26[3] = (float)((uint)bVar5 * auVar37._12_4_ | (uint)!bVar5 * (int)pfVar26[3]);
        pfVar26[4] = (float)((uint)bVar6 * auVar37._16_4_ | (uint)!bVar6 * (int)pfVar26[4]);
        pfVar26[5] = (float)((uint)bVar7 * auVar37._20_4_ | (uint)!bVar7 * (int)pfVar26[5]);
        pfVar26[6] = (float)((uint)bVar8 * auVar37._24_4_ | (uint)!bVar8 * (int)pfVar26[6]);
        pfVar26[7] = (float)((uint)bVar9 * auVar37._28_4_ | (uint)!bVar9 * (int)pfVar26[7]);
        pfVar26[8] = (float)((uint)(bVar20 & 1) * auVar37._32_4_ |
                            (uint)!(bool)(bVar20 & 1) * (int)pfVar26[8]);
        pfVar26[9] = (float)((uint)bVar10 * auVar37._36_4_ | (uint)!bVar10 * (int)pfVar26[9]);
        pfVar26[10] = (float)((uint)bVar11 * auVar37._40_4_ | (uint)!bVar11 * (int)pfVar26[10]);
        pfVar26[0xb] = (float)((uint)bVar12 * auVar37._44_4_ | (uint)!bVar12 * (int)pfVar26[0xb]);
        pfVar26[0xc] = (float)((uint)bVar13 * auVar37._48_4_ | (uint)!bVar13 * (int)pfVar26[0xc]);
        pfVar26[0xd] = (float)((uint)bVar14 * auVar37._52_4_ | (uint)!bVar14 * (int)pfVar26[0xd]);
        pfVar26[0xe] = (float)((uint)bVar15 * auVar37._56_4_ | (uint)!bVar15 * (int)pfVar26[0xe]);
        pfVar26[0xf] = (float)((uint)(bVar20 >> 7) * auVar37._60_4_ |
                              (uint)!(bool)(bVar20 >> 7) * (int)pfVar26[0xf]);
        uVar28 = uVar28 + 0x10;
      } while (((int)fVar25 + 0xfU & 0xfffffff0) != uVar28);
    }
    auVar45 = ZEXT1260(auVar44);
    v_01.ptr = (float *)local_d8._0_8_;
    SampledGrid<float>::SampledGrid
              ((SampledGrid<float> *)local_1d8,v_01,iVar23,ny_00,
               amStack_138[4]._vptr_memory_resource._0_4_,alloc);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
              ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_148,
               (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_1d8);
  }
  amStack_138[3]._vptr_memory_resource._0_4_ = local_1b0;
  amStack_138[2]._vptr_memory_resource = (_func_int **)local_1b8;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_1d8);
  local_1d8 = (undefined1  [8])&aStack_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"p0","");
  local_a8.x = 0.0;
  local_a8.y = 0.0;
  local_a8.z = 0.0;
  PVar46 = ParameterDictionary::GetOnePoint3f(parameters,(string *)local_1d8,(Point3f *)&local_a8);
  amStack_138[4]._vptr_memory_resource._0_4_ = PVar46.super_Tuple3<pbrt::Point3,_float>.x;
  amStack_138[4]._vptr_memory_resource._4_4_ = PVar46.super_Tuple3<pbrt::Point3,_float>.y;
  amStack_138[5]._vptr_memory_resource = (_func_int **)pPVar39;
  if (local_1d8 != (undefined1  [8])&aStack_1c8) {
    operator_delete((void *)local_1d8,
                    CONCAT44(aStack_1c8._M_allocated_capacity._4_4_,
                             aStack_1c8._M_allocated_capacity._0_4_) + 1);
  }
  local_1d8 = (undefined1  [8])&aStack_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"p1","");
  auVar41._8_4_ = 0x3f800000;
  auVar41._0_8_ = 0x3f8000003f800000;
  auVar41._12_4_ = 0x3f800000;
  auVar42 = ZEXT856(auVar41._8_8_);
  local_a8._0_8_ = vmovlps_avx(auVar41);
  local_a8.z = 1.0;
  PVar47 = ParameterDictionary::GetOnePoint3f(parameters,(string *)local_1d8,(Point3f *)&local_a8);
  auVar34._0_4_ = PVar47.super_Tuple3<pbrt::Point3,_float>.z;
  auVar34._4_60_ = auVar45;
  auVar43 = auVar34._0_16_;
  auVar33._0_8_ = PVar47.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar33._8_56_ = auVar42;
  auVar41 = auVar33._0_16_;
  if (local_1d8 != (undefined1  [8])&aStack_1c8) {
    local_108 = auVar34._0_4_;
    local_168._0_16_ = auVar33._0_16_;
    operator_delete((void *)local_1d8,
                    CONCAT44(aStack_1c8._M_allocated_capacity._4_4_,
                             aStack_1c8._M_allocated_capacity._0_4_) + 1);
    auVar43 = ZEXT416((uint)local_108);
    auVar41 = local_168._0_16_;
  }
  auVar21._4_4_ = amStack_138[4]._vptr_memory_resource._4_4_;
  auVar21._0_4_ = amStack_138[4]._vptr_memory_resource._0_4_;
  auVar21._8_8_ = amStack_138[5]._vptr_memory_resource;
  auVar16 = vminps_avx(auVar41,auVar21);
  auVar17 = vminss_avx(auVar43,ZEXT416((uint)PVar46.super_Tuple3<pbrt::Point3,_float>.z));
  auVar41 = vmaxps_avx(auVar41,auVar21);
  auVar43 = vmaxss_avx(auVar43,ZEXT416((uint)PVar46.super_Tuple3<pbrt::Point3,_float>.z));
  local_1d8 = (undefined1  [8])vmovlps_avx(auVar16);
  uStack_1d0._0_4_ = auVar17._0_4_;
  uVar18 = vmovlps_avx(auVar41);
  uStack_1d0._4_4_ = (float)uVar18;
  aStack_1c8._M_allocated_capacity._0_4_ = (undefined4)((ulong)uVar18 >> 0x20);
  aStack_1c8._M_allocated_capacity._4_4_ = auVar43._0_4_;
  iVar23 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0xe8,8);
  pstd::pmr::polymorphic_allocator<std::byte>::
  construct<pbrt::UniformGridMediumProvider,pbrt::Bounds3<float>,pstd::optional<pbrt::SampledGrid<float>>,pstd::optional<pbrt::SampledGrid<pbrt::RGBUnboundedSpectrum>>,pbrt::RGBColorSpace_const*&,pbrt::SpectrumHandle&,pbrt::SampledGrid<float>,pstd::pmr::polymorphic_allocator<std::byte>&>
            (&local_80,(UniformGridMediumProvider *)CONCAT44(extraout_var_00,iVar23),
             (Bounds3<float> *)local_1d8,(optional<pbrt::SampledGrid<float>_> *)local_1a0,&local_68,
             &local_90,(SpectrumHandle *)local_150,(SampledGrid<float> *)local_148,&local_80);
  if ((Tuple2<pbrt::Point2,_float>)local_d8._0_8_ != (Tuple2<pbrt::Point2,_float>)0x0) {
    operator_delete((void *)local_d8._0_8_,(long)local_c8 - local_d8._0_8_);
  }
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_148);
  if (local_68.set == true) {
    pstd::
    vector<pbrt::RGBUnboundedSpectrum,_pstd::pmr::polymorphic_allocator<pbrt::RGBUnboundedSpectrum>_>
    ::~vector((vector<pbrt::RGBUnboundedSpectrum,_pstd::pmr::polymorphic_allocator<pbrt::RGBUnboundedSpectrum>_>
               *)&local_68);
  }
  if (local_170 == true) {
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
              ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_1a0);
  }
  if ((RGBColorSpace *)
      local_f0.super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl.
      super__Vector_impl_data._M_start != (RGBColorSpace *)0x0) {
    operator_delete(local_f0.super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  if (local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (UniformGridMediumProvider *)CONCAT44(extraout_var_00,iVar23);
}

Assistant:

UniformGridMediumProvider *UniformGridMediumProvider::Create(
    const ParameterDictionary &parameters, const FileLoc *loc, Allocator alloc) {
    std::vector<Float> density = parameters.GetFloatArray("density");
    std::vector<RGB> rgbDensity = parameters.GetRGBArray("density");
    if (density.empty() && rgbDensity.empty())
        ErrorExit(loc, "No \"density\" values provided for uniform grid medium.");
    if (!density.empty() && !rgbDensity.empty())
        ErrorExit(loc, "Both \"float\" and \"rgb\" \"density\" values were provided.");

    int nx = parameters.GetOneInt("nx", 1);
    int ny = parameters.GetOneInt("ny", 1);
    int nz = parameters.GetOneInt("nz", 1);
    size_t nDensity = !density.empty() ? density.size() : rgbDensity.size();
    if (nDensity != nx * ny * nz)
        ErrorExit(loc,
                  "Uniform grid medium has %d density values; expected nx*ny*nz = %d",
                  nDensity, nx * ny * nz);

    const RGBColorSpace *colorSpace = parameters.ColorSpace();

    pstd::optional<SampledGrid<Float>> densityGrid;
    pstd::optional<SampledGrid<RGBUnboundedSpectrum>> rgbDensityGrid;
    if (density.size())
        densityGrid = SampledGrid<Float>(density, nx, ny, nz, alloc);
    else {
        std::vector<RGBUnboundedSpectrum> rgbSpectrumDensity;
        for (RGB rgb : rgbDensity)
            rgbSpectrumDensity.push_back(RGBUnboundedSpectrum(*colorSpace, rgb));
        rgbDensityGrid =
            SampledGrid<RGBUnboundedSpectrum>(rgbSpectrumDensity, nx, ny, nz, alloc);
    }

    SpectrumHandle Le =
        parameters.GetOneSpectrum("Le", nullptr, SpectrumType::Illuminant, alloc);
    Float LeNorm = 1;
    if (Le == nullptr || Le.MaxValue() == 0)
        Le = alloc.new_object<ConstantSpectrum>(0.f);
    else
        LeNorm = 1 / SpectrumToPhotometric(Le);

    SampledGrid<Float> LeGrid(alloc);
    std::vector<Float> LeScale = parameters.GetFloatArray("Lescale");
    if (LeScale.empty())
        LeGrid = SampledGrid<Float>({LeNorm}, 1, 1, 1, alloc);
    else {
        if (LeScale.size() != nx * ny * nz)
            ErrorExit("Expected %d x %d %d = %d values for \"Lescale\" but were "
                      "given %d.",
                      nx, ny, nz, nx * ny * nz, LeScale.size());
        for (int i = 0; i < nx * ny * nz; ++i)
            LeScale[i] *= LeNorm;
        LeGrid = SampledGrid<Float>(LeScale, nx, ny, nz, alloc);
    }

    Point3f p0 = parameters.GetOnePoint3f("p0", Point3f(0.f, 0.f, 0.f));
    Point3f p1 = parameters.GetOnePoint3f("p1", Point3f(1.f, 1.f, 1.f));

    return alloc.new_object<UniformGridMediumProvider>(
        Bounds3f(p0, p1), std::move(densityGrid), std::move(rgbDensityGrid), colorSpace,
        Le, std::move(LeGrid), alloc);
}